

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::findxtname(Forth *this)

{
  uint index;
  Cell index_00;
  Definition *pDVar1;
  string wordBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  requireDStackDepth(this,1,"FIND-XT-NAME");
  wordBuffer._M_dataplus._M_p = (pointer)&wordBuffer.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&wordBuffer,0x10,' ');
  index = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  index_00 = dataSpaceAtCell(this,index);
  if ((index_00 != 0) &&
     ((ulong)index_00 <
      (ulong)(((long)(this->definitions).
                     super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->definitions).
                    super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x50))) {
    pDVar1 = definitionsAt(this,index_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&wordBuffer,&pDVar1->name);
  }
  if (wordBuffer._M_string_length < 0x10) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_40,0x10 - wordBuffer._M_string_length,' ');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&wordBuffer,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (this->writeToTarget == ToStdCout) {
    std::operator<<((ostream *)&std::cout,(string *)&wordBuffer);
    std::ostream::flush();
  }
  else if (this->writeToTarget == ToString) {
    std::operator<<((ostream *)&this->field_0x20,(string *)&wordBuffer);
  }
  std::__cxx11::string::~string((string *)&wordBuffer);
  return;
}

Assistant:

void  findxtname() {
			REQUIRE_DSTACK_DEPTH(1, "FIND-XT-NAME");
			std::string wordBuffer(16,' ');
			auto address = dStack.getTop(); pop();
			auto xt=CELL(getDataCell(address));
			auto xtfound=findXt(xt);
			//std::cout << std::endl << address << " "<< xt << " " << xtfound << std::endl;
			if(xtfound>0){
				wordBuffer=definitionsAt(xtfound).name;	
				//std::cerr << " more " << wordBuffer;
			} 
			if(wordBuffer.size()<16) {
			 wordBuffer.append(std::string(16-wordBuffer.size(), ' '));
			}

#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << wordBuffer  ;
				break;
			case ToStdCout:
				std::cout << wordBuffer ;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}